

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::ensureTextLayouted(QLabelPrivate *this)

{
  long lVar1;
  int iVar2;
  QRect *this_00;
  QTextOption *in_RDI;
  long in_FS_OFFSET;
  QTextDocument *doc;
  QTextOption opt;
  QTextFrameFormat fmt;
  QTextFrameFormat *in_stack_ffffffffffffff98;
  QTextOption *this_01;
  QLabelPrivate *in_stack_ffffffffffffffc8;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 *local_20;
  QLabelPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ushort *)(in_RDI + 0x340) >> 2 & 1) != 0) {
    this_01 = in_RDI;
    ensureTextPopulated(in_stack_ffffffffffffffe8);
    if (*(long *)(in_RDI + 0x2f8) != 0) {
      this_00 = (QRect *)QWidgetTextControl::document((QWidgetTextControl *)in_RDI);
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = 0xffffffffffffffff;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QTextDocument::defaultTextOption();
      QFlag::QFlag((QFlag *)&stack0xffffffffffffffc8,*(int *)(in_RDI + 0x338));
      QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
                ((QFlags<Qt::AlignmentFlag> *)in_stack_ffffffffffffff98,
                 (QFlag)(int)((ulong)in_RDI >> 0x20));
      QTextOption::setAlignment
                (in_RDI,(QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)this_00 >> 0x20,0));
      if ((*(uint *)(in_RDI + 0x338) & 0x1000) == 0) {
        QTextOption::setWrapMode((QTextOption *)&local_30,ManualWrap);
      }
      else {
        QTextOption::setWrapMode((QTextOption *)&local_30,WordWrap);
      }
      QTextDocument::setDefaultTextOption((QTextOption *)this_00);
      QTextDocument::rootFrame();
      QTextFrame::frameFormat((QTextFrame *)this_01);
      QTextFrameFormat::setMargin(0.0);
      QTextDocument::rootFrame();
      QTextFrame::setFrameFormat((QTextFrame *)in_RDI,in_stack_ffffffffffffff98);
      documentRect(in_stack_ffffffffffffffc8);
      iVar2 = QRect::width(this_00);
      QTextDocument::setTextWidth((double)iVar2);
      QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x5afaed);
      QTextOption::~QTextOption((QTextOption *)&local_30);
    }
    *(ushort *)(in_RDI + 0x340) = *(ushort *)(in_RDI + 0x340) & 0xfffb;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabelPrivate::ensureTextLayouted() const
{
    if (!textLayoutDirty)
        return;
    ensureTextPopulated();
    if (control) {
        QTextDocument *doc = control->document();
        QTextOption opt = doc->defaultTextOption();

        opt.setAlignment(QFlag(this->align));

        if (this->align & Qt::TextWordWrap)
            opt.setWrapMode(QTextOption::WordWrap);
        else
            opt.setWrapMode(QTextOption::ManualWrap);

        doc->setDefaultTextOption(opt);

        QTextFrameFormat fmt = doc->rootFrame()->frameFormat();
        fmt.setMargin(0);
        doc->rootFrame()->setFrameFormat(fmt);
        doc->setTextWidth(documentRect().width());
    }
    textLayoutDirty = false;
}